

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          StringViewArg filename,DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *message_type_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *field;
  int iVar2;
  
  if (0 < *(int *)((long)&message_type->field_0 + 0x28)) {
    iVar2 = 0;
    do {
      message_type_00 =
           internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(message_type->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,iVar2)
      ;
      bVar1 = AddNestedExtensions(this,filename,message_type_00,value);
      if (!bVar1) {
        return false;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)&message_type->field_0 + 0x28));
  }
  if (*(int *)((long)&message_type->field_0 + 0x70) < 1) {
    bVar1 = true;
  }
  else {
    iVar2 = 0;
    do {
      field = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                        (&(message_type->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar2
                        );
      bVar1 = AddExtension(this,filename,field,value);
      if (!bVar1) {
        return bVar1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)&message_type->field_0 + 0x70));
  }
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    StringViewArg filename, const DescriptorProto& message_type, Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}